

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.h
# Opt level: O0

double __thiscall
mp::internal::BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
VisitBinary(BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector> *this,
           BinaryExpr e)

{
  Kind KVar1;
  ExprBase this_00;
  undefined8 uVar2;
  ExprBase in_RSI;
  Impl *in_RDI;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  *in_stack_ffffffffffffff68;
  type_conflict1 tVar3;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffff78;
  ExprBase in_stack_ffffffffffffff80;
  BasicCStringRef<char> local_70;
  ExprBase local_68;
  UnsupportedError *in_stack_ffffffffffffffa8;
  CStringRef in_stack_ffffffffffffffb0;
  ExprBase var;
  double local_8;
  
  var.impl_ = in_RDI;
  KVar1 = ExprBase::kind((ExprBase *)0x1cc111);
  tVar3 = (type_conflict1)((ulong)in_RDI >> 0x20);
  if (KVar1 == MUL) {
    this_00.impl_ =
         (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                 ::rhs(in_stack_ffffffffffffff68);
    KVar1 = ExprBase::kind((ExprBase *)0x1cc138);
    if (KVar1 == FIRST_REFERENCE) {
      BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
      ::lhs(in_stack_ffffffffffffff68);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_ffffffffffffff78,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff80.impl_,
                 tVar3);
      BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
      ::rhs(in_stack_ffffffffffffff68);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_ffffffffffffff78,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff80.impl_,
                 tVar3);
      local_8 = DoAddTerm((BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>
                           *)this_00.impl_,(Expr)in_RSI.impl_,(Expr)var.impl_);
    }
    else {
      BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
      ::lhs(in_stack_ffffffffffffff68);
      KVar1 = ExprBase::kind((ExprBase *)0x1cc1c1);
      if (KVar1 != FIRST_REFERENCE) {
        uVar2 = __cxa_allocate_exception(0x18);
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_70,"nonlinear expression");
        UnsupportedError::UnsupportedError<>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
        __cxa_throw(uVar2,&UnsupportedError::typeinfo,UnsupportedError::~UnsupportedError);
      }
      BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
      ::rhs(in_stack_ffffffffffffff68);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_ffffffffffffff78,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff80.impl_,
                 tVar3);
      local_68.impl_ =
           (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                   ::lhs(in_stack_ffffffffffffff68);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_ffffffffffffff78,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff80.impl_,
                 tVar3);
      local_8 = DoAddTerm((BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>
                           *)this_00.impl_,(Expr)in_RSI.impl_,(Expr)var.impl_);
    }
  }
  else {
    local_8 = BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
              ::VisitBinary((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                             *)in_RSI.impl_,(BinaryExpr)in_stack_ffffffffffffff80.impl_);
  }
  return local_8;
}

Assistant:

double BasicRandomAffineExprExtractor<Impl>::VisitBinary(BinaryExpr e) {
  switch (e.kind()) {
  case expr::MUL:
    if (e.rhs().kind() == expr::VARIABLE)
      return DoAddTerm(e.lhs(), e.rhs());
    if (e.lhs().kind() == expr::VARIABLE)
      return DoAddTerm(e.rhs(), e.lhs());
    throw UnsupportedError("nonlinear expression");
    break;
  default:
    return Base::VisitBinary(e);
  }
}